

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_long,_long,_5>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,long *rhs,unsigned_long *result)

{
  ulong t;
  ulong uVar1;
  uint64_t uVar2;
  unsigned_long tmp;
  
  t = *rhs;
  uVar1 = *lhs;
  if ((long)t < 0) {
    uVar2 = AbsValueHelper<long,_1>::Abs(t);
    *result = uVar2 + uVar1;
    if (CARRY8(uVar2,uVar1)) goto LAB_0013c6a8;
  }
  else {
    if (uVar1 < t) {
LAB_0013c6a8:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *result = uVar1 - t;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::uint64_t, rhs signed
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (std::uint64_t)rhs );
                return;
            }
        }
        else
        {
            T tmp = lhs;
            // we're now effectively adding
            result = lhs + AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if(result >= tmp)
                return;
        }

        E::SafeIntOnOverflow();
    }